

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

string * __thiscall
pbrt::BilinearPatchMesh::ToString_abi_cxx11_(string *__return_storage_ptr__,BilinearPatchMesh *this)

{
  int *args_1;
  int *args_2;
  Point3f *pPVar1;
  Normal3f *pNVar2;
  span<const_pbrt::Normal3<float>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8;
  allocator<char> local_15c;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  Normal3f *local_158;
  Point3f *local_150;
  string *local_148;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string np;
  int *local_80;
  long local_78;
  Point2f *local_70;
  long local_68;
  Normal3f *local_60;
  long local_58;
  Point3f *local_50;
  long local_48;
  int *local_40;
  span<const_pbrt::Normal3<float>_> *local_38;
  
  local_148 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&np,"(nullptr)",(allocator<char> *)&local_140);
  args_1 = &this->nPatches;
  if (this->vertexIndices == (int *)0x0) {
    std::__cxx11::string::string((string *)&local_140,(string *)&np);
  }
  else {
    in_RCX = (span<const_pbrt::Normal3<float>_> *)((long)*args_1 << 2);
    local_40 = this->vertexIndices;
    local_38 = in_RCX;
    StringPrintf<pstd::span<int_const>>
              (&local_140,(pbrt *)0x2c760fd,(char *)&local_40,(span<const_int> *)in_RCX);
  }
  pPVar1 = this->p;
  args_2 = &this->nVertices;
  if (pPVar1 == (Point3f *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,(char *)0x0,&local_159);
  }
  else {
    local_48 = (long)*args_2;
    local_50 = pPVar1;
    StringPrintf<pstd::span<pbrt::Point3<float>const>>
              (&local_c0,(pbrt *)0x2c760fd,(char *)&local_50,
               (span<const_pbrt::Point3<float>_> *)in_RCX);
  }
  pNVar2 = this->n;
  local_150 = pPVar1;
  if (pNVar2 == (Normal3f *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,(char *)0x0,&local_15a);
  }
  else {
    local_58 = (long)*args_2;
    local_60 = pNVar2;
    StringPrintf<pstd::span<pbrt::Normal3<float>const>>
              (&local_e0,(pbrt *)0x2c760fd,(char *)&local_60,in_RCX);
  }
  local_158 = pNVar2;
  if (this->uv == (Point2f *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,(char *)0x0,&local_15b);
  }
  else {
    local_68 = (long)*args_2;
    local_70 = this->uv;
    StringPrintf<pstd::span<pbrt::Point2<float>const>>
              (&local_100,(pbrt *)0x2c760fd,(char *)&local_70,
               (span<const_pbrt::Point2<float>_> *)in_RCX);
  }
  if (this->faceIndices == (int *)0x0) {
    args_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28d739;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,(char *)0x0,&local_15c);
  }
  else {
    local_78 = (long)*args_1;
    args_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28d726;
    local_80 = this->faceIndices;
    StringPrintf<pstd::span<int_const>>
              (&local_120,(pbrt *)0x2c760fd,(char *)&local_80,(span<const_int> *)in_RCX);
  }
  StringPrintf<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (local_148,
             (pbrt *)
             "[ BilinearMatchMesh reverseOrientation: %s transformSwapsHandedness: %s nPatches: %d nVertices: %d vertexIndices: %s p: %s n: %s uv: %s faceIndices: %s ]"
             ,&this->reverseOrientation,&this->transformSwapsHandedness,(bool *)args_1,args_2,
             (int *)&local_140,&local_c0,&local_e0,&local_100,&local_120,args_8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&np);
  return local_148;
}

Assistant:

std::string BilinearPatchMesh::ToString() const {
    std::string np = "(nullptr)";
    return StringPrintf(
        "[ BilinearMatchMesh reverseOrientation: %s transformSwapsHandedness: "
        "%s "
        "nPatches: %d nVertices: %d vertexIndices: %s p: %s n: %s "
        "uv: %s faceIndices: %s ]",
        reverseOrientation, transformSwapsHandedness, nPatches, nVertices,
        vertexIndices ? StringPrintf("%s", pstd::MakeSpan(vertexIndices, 4 * nPatches))
                      : np,
        p ? StringPrintf("%s", pstd::MakeSpan(p, nVertices)) : nullptr,
        n ? StringPrintf("%s", pstd::MakeSpan(n, nVertices)) : nullptr,
        uv ? StringPrintf("%s", pstd::MakeSpan(uv, nVertices)) : nullptr,
        faceIndices ? StringPrintf("%s", pstd::MakeSpan(faceIndices, nPatches))
                    : nullptr);
}